

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clunk.cpp
# Opt level: O0

void __thiscall clunk::Node::GetKingMoves<false,true>(Node *this,int depth)

{
  uint from_00;
  int to_00;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint pc;
  bool bVar9;
  int cap;
  int to;
  uint64_t mvs;
  int score;
  int kdir;
  int from;
  int depth_local;
  Node *this_local;
  
  if (this->checks != 0) {
    __assert_fail("!checks",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x77d,"void clunk::Node::GetKingMoves(const int) [color = false, qsearch = true]"
                 );
  }
  if (*_KING != '\f') {
    __assert_fail("_KING[color]->type == (color|King)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x77e,"void clunk::Node::GetKingMoves(const int) [color = false, qsearch = true]"
                 );
  }
  from_00 = (uint)(byte)_KING[1];
  if ((_KING[1] & 0x88) != 0) {
    __assert_fail("IS_SQUARE(from)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x781,"void clunk::Node::GetKingMoves(const int) [color = false, qsearch = true]"
                 );
  }
  if ((undefined *)(&_board)[(int)from_00] != _KING) {
    __assert_fail("_board[from] == _KING[color]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x782,"void clunk::Node::GetKingMoves(const int) [color = false, qsearch = true]"
                 );
  }
  mvs._4_4_ = 0;
  if (depth == 0) {
    mvs._4_4_ = GetDiscoverDir(this,false,from_00);
  }
  _cap = *(ulong *)(_queenKing + (long)(int)(from_00 + 8) * 8);
  while( true ) {
    if (_cap == 0) {
      return;
    }
    if ((_cap & 0xff) == 0) {
      __assert_fail("mvs & 0xFF",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0x78b,
                    "void clunk::Node::GetKingMoves(const int) [color = false, qsearch = true]");
    }
    to_00 = ((uint)_cap & 0xff) - 1;
    iVar1 = Distance(from_00,to_00);
    if (iVar1 != 1) {
      __assert_fail("Distance(from, to) == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0x78d,
                    "void clunk::Node::GetKingMoves(const int) [color = false, qsearch = true]");
    }
    iVar1 = Direction(from_00,to_00);
    iVar2 = Direction(from_00,to_00);
    iVar3 = Direction(from_00,to_00);
    iVar4 = Direction(from_00,to_00);
    iVar5 = Direction(from_00,to_00);
    iVar6 = Direction(from_00,to_00);
    iVar7 = Direction(from_00,to_00);
    iVar8 = Direction(from_00,to_00);
    if ((((iVar1 != -0x11 && iVar2 != -0xf) && iVar3 != 0xf) && iVar4 != 0x11) &&
        (((iVar5 != -0x10 && iVar6 != -1) && iVar7 != 1) && iVar8 != 0x10)) break;
    pc = (uint)*(byte *)(&_board)[to_00];
    bVar9 = true;
    if (pc == 0) {
      bVar9 = (undefined *)(&_board)[to_00] == _EMPTY;
    }
    if (!bVar9) {
      __assert_fail("cap || (_board[to] == _EMPTY)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0x791,
                    "void clunk::Node::GetKingMoves(const int) [color = false, qsearch = true]");
    }
    if (pc == 0) {
      if (mvs._4_4_ != 0) {
        iVar1 = Direction(from_00,to_00);
        if (iVar1 < 1) {
          iVar1 = -iVar1;
        }
        if ((mvs._4_4_ != iVar1) && (bVar9 = AttackedBy<true>(to_00), !bVar9)) {
          AddMove(this,KingMove,from_00,to_00,
                  (*(int *)(_SQR + (long)to_00 * 4) - *(int *)(_SQR + (long)(int)from_00 * 4)) + -10
                  ,0,0);
        }
      }
    }
    else if (((*(byte *)(&_board)[to_00] & 1) != 0) && (bVar9 = AttackedBy<true>(to_00), !bVar9)) {
      iVar1 = ValueOf(pc);
      AddMove(this,KingMove,from_00,to_00,
              ((iVar1 + *(int *)(_SQR + (long)to_00 * 4)) - *(int *)(_SQR + (long)(int)from_00 * 4))
              + -0x50,pc,0);
    }
    _cap = _cap >> 8;
  }
  __assert_fail("IS_DIR(Direction(from, to))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                ,0x78e,"void clunk::Node::GetKingMoves(const int) [color = false, qsearch = true]");
}

Assistant:

void GetKingMoves(const int depth) {
    assert(!checks);
    assert(_KING[color]->type == (color|King));

    const int from = _KING[color]->sqr;
    assert(IS_SQUARE(from));
    assert(_board[from] == _KING[color]);

    int kdir = 0;
    if (qsearch & (!depth)) {
      kdir = GetDiscoverDir(color, from);
    }

    int score;
    for (uint64_t mvs = _queenKing[from + 8]; mvs; mvs >>= 8) {
      assert(mvs & 0xFF);
      const int to = ((mvs & 0xFF) - 1);
      assert(Distance(from, to) == 1);
      assert(IS_DIR(Direction(from, to)));
      if (qsearch) {
        const int cap = _board[to]->type;
        assert(cap || (_board[to] == _EMPTY));
        if (cap) {
          if ((COLOR(cap) != color) && !AttackedBy<!color>(to)) {
            score = (ValueOf(cap) + _SQR[to] - _SQR[from] - 80);
            AddMove(KingMove, from, to, score, cap);
          }
        }
        else if (kdir && (kdir != abs(Direction(from, to)))) {
          if (!AttackedBy<!color>(to)) {
            score = (_SQR[to] - _SQR[from] - 10);
            AddMove(KingMove, from, to, score);
          }
        }
      }
      else if (!AttackedBy<!color>(to)) {
        const int cap = _board[to]->type;
        assert(cap || (_board[to] == _EMPTY));
        if (!cap) {
          score = (_SQR[to] - _SQR[from] - 20);
          AddMove(KingMove, from, to, score);
          if ((to == (color ? F8 : F1)) &&
              (state & (color ? BlackShort : WhiteShort)) &&
              (_board[color ? G8 : G1] == _EMPTY) &&
              !AttackedBy<!color>(color ? G8 : G1))
          {
            assert(from == (color ? E8 : E1));
            assert(_board[color ? H8 : H1]->type == (color|Rook));
            AddMove(CastleShort, from, (color ? G8 : G1), 50);
          }
          else if ((to == (color ? D8 : D1)) &&
                   (state & (color ? BlackLong : WhiteLong)) &&
                   (_board[color ? C8 : C1] == _EMPTY) &&
                   (_board[color ? B8 : B1] == _EMPTY) &&
                   !AttackedBy<!color>(color ? C8 : C1))
          {
            assert(from == (color ? E8 : E1));
            assert(_board[color ? A8 : A1]->type == (color|Rook));
            AddMove(CastleLong, from, (color ? C8 : C1), 50);
          }
        }
        else if (COLOR(cap) != color) {
          score = (ValueOf(cap) + _SQR[to] - _SQR[from] - 80);
          AddMove(KingMove, from, to, score, cap);
        }
      }
    }
  }